

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_optional.h
# Opt level: O0

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::character_t<char>,date::fraction_t<unsigned_int,9u>,date::cases_t<date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_> *fmt,
               cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *others)

{
  bool bVar1;
  undefined1 local_50 [8];
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> begin;
  cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
  *others_local;
  optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_> *fmt_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos_local;
  
  begin.m_position = (size_t)others;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::iterator_proxy
            ((iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)local_50,
             pos);
  bVar1 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,std::tuple<date::character_t<char>,date::fraction_t<unsigned_int,9u>>,0ul,1ul>
                    (pos,end,fmt);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator=
              (pos,(iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                   local_50);
  }
  bVar1 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>
                    (pos,end,(cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
                              *)begin.m_position);
  return bVar1;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, optional_t<Formatters...>& fmt, Others&&... others)
{
    Iterator begin = pos;
    if (!read_impl(pos, end, fmt.formatters, std_impl::make_index_sequence<sizeof...(Formatters)>{}))
    {
        //! TODO: unset values of the optional formatters.
        pos = std::move(begin);
    }
    return read_impl(pos, end, std::forward<Others>(others)...);
}